

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

bool __thiscall
ON_NurbsCage::SetCV(ON_NurbsCage *this,int i,int j,int k,point_style style,double *Point)

{
  double *__dest;
  double dVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t __n;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  pdVar2 = this->m_cv;
  if ((pdVar2 == (double *)0x0) || (3 < style - not_rational)) {
    return false;
  }
  lVar7 = (long)(this->m_cv_stride[0] * i);
  lVar5 = (long)(j * this->m_cv_stride[1]);
  lVar8 = (long)(k * this->m_cv_stride[2]);
  __dest = pdVar2 + lVar7 + lVar5 + lVar8;
  switch(style) {
  case not_rational:
    memcpy(__dest,Point,(long)this->m_dim << 3);
    if (this->m_is_rat == true) {
      __dest[this->m_dim] = 1.0;
      return true;
    }
    return true;
  case homogeneous_rational:
    lVar4 = (long)this->m_dim;
    if (this->m_is_rat != true) {
      if (0 < this->m_dim) {
        dVar1 = Point[lVar4];
        uVar9 = -(ulong)(dVar1 != 0.0);
        lVar6 = 0;
        do {
          pdVar2[lVar5 + lVar7 + lVar8 + lVar6] =
               Point[lVar6] * (double)(~uVar9 & 0x3ff0000000000000 | (ulong)(1.0 / dVar1) & uVar9);
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
        return true;
      }
      return true;
    }
    __n = lVar4 * 8 + 8;
    goto LAB_0054dded;
  case euclidean_rational:
    iVar3 = this->m_dim;
    lVar5 = (long)iVar3;
    if (this->m_is_rat == true) {
      dVar1 = Point[lVar5];
      if (0 < iVar3) {
        do {
          __dest[i] = Point[i] * dVar1;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      __dest[lVar5] = dVar1;
      return true;
    }
    break;
  case intrinsic_point_style:
    lVar5 = (long)this->m_dim + (ulong)this->m_is_rat;
  }
  __n = lVar5 << 3;
LAB_0054dded:
  memcpy(__dest,Point,__n);
  return true;
}

Assistant:

bool ON_NurbsCage::SetCV( int i, int j, int k, ON::point_style style, const double* Point )
{
  bool rc = true;
  int n;
  double w;

  double* cv = CV(i,j,k);
  if ( !cv )
    return false;

  switch ( style ) {

  case ON::not_rational:  // input Point is not rational
    memcpy( cv, Point, m_dim*sizeof(*cv) );
    if ( IsRational() ) {
      // NURBS surface is rational - set weight to one
      cv[m_dim] = 1.0;
    }
    break;

  case ON::homogeneous_rational:  // input Point is homogeneous rational
    if ( IsRational() ) {
      // NURBS surface is rational
      memcpy( cv, Point, (m_dim+1)*sizeof(*cv) );
    }
    else {
      // NURBS surface is not rational
      w = (Point[m_dim] != 0.0) ? 1.0/Point[m_dim] : 1.0;
      for ( n = 0; n < m_dim; n++ ) {
        cv[n] = w*Point[n];
      }
    }
    break;

  case ON::euclidean_rational:  // input Point is euclidean rational
    if ( IsRational() ) {
      // NURBS surface is rational - convert euclean point to homogeneous form
      w = Point[m_dim];
      for ( n = 0; n < m_dim; n++ )
        cv[i] = w*Point[i];
      cv[m_dim] = w;
    }
    else {
      // NURBS surface is not rational
      memcpy( cv, Point, m_dim*sizeof(*cv) );
    }
    break;

  case ON::intrinsic_point_style:
    n = m_is_rat?m_dim+1:m_dim;
    memcpy(cv,Point,n*sizeof(*cv));
    break;
    
  default:
    rc = false;
    break;
  }
  return rc;
}